

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O0

int labeled_extract(ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,void *output,
                   ptls_iovec_t salt,char *label,ptls_iovec_t ikm)

{
  size_t len;
  ptls_iovec_t ikm_00;
  ptls_hash_algorithm_t *local_c8;
  int local_9c;
  undefined1 local_98 [4];
  int ret;
  uint8_t labeled_ikm_smallbuf [64];
  ptls_buffer_t labeled_ikm;
  char *label_local;
  void *output_local;
  ptls_hpke_cipher_suite_t *cipher_local;
  ptls_hpke_kem_t *kem_local;
  ptls_iovec_t salt_local;
  
  ptls_buffer_init((ptls_buffer_t *)(labeled_ikm_smallbuf + 0x38),local_98,0x40);
  local_9c = ptls_buffer__do_pushv((ptls_buffer_t *)(labeled_ikm_smallbuf + 0x38),"HPKE-v1",7);
  if ((local_9c == 0) &&
     (local_9c = build_suite_id((ptls_buffer_t *)(labeled_ikm_smallbuf + 0x38),kem,cipher),
     local_9c == 0)) {
    len = strlen(label);
    local_9c = ptls_buffer__do_pushv((ptls_buffer_t *)(labeled_ikm_smallbuf + 0x38),label,len);
    if (local_9c == 0) {
      local_9c = ptls_buffer__do_pushv
                           ((ptls_buffer_t *)(labeled_ikm_smallbuf + 0x38),ikm.base,ikm.len);
      if (local_9c == 0) {
        if (cipher == (ptls_hpke_cipher_suite_t *)0x0) {
          local_c8 = kem->hash;
        }
        else {
          local_c8 = cipher->hash;
        }
        ikm_00 = ptls_iovec_init((void *)labeled_ikm_smallbuf._56_8_,labeled_ikm.capacity);
        local_9c = ptls_hkdf_extract(local_c8,output,salt,ikm_00);
      }
    }
  }
  ptls_buffer_dispose((ptls_buffer_t *)(labeled_ikm_smallbuf + 0x38));
  return local_9c;
}

Assistant:

static int labeled_extract(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, void *output, ptls_iovec_t salt,
                           const char *label, ptls_iovec_t ikm)
{
    ptls_buffer_t labeled_ikm;
    uint8_t labeled_ikm_smallbuf[64];
    int ret;

    ptls_buffer_init(&labeled_ikm, labeled_ikm_smallbuf, sizeof(labeled_ikm_smallbuf));

    ptls_buffer_pushv(&labeled_ikm, HPKE_V1_LABEL, strlen(HPKE_V1_LABEL));
    if ((ret = build_suite_id(&labeled_ikm, kem, cipher)) != 0)
        goto Exit;
    ptls_buffer_pushv(&labeled_ikm, label, strlen(label));
    ptls_buffer_pushv(&labeled_ikm, ikm.base, ikm.len);

    ret = ptls_hkdf_extract(cipher != NULL ? cipher->hash : kem->hash, output, salt,
                            ptls_iovec_init(labeled_ikm.base, labeled_ikm.off));

Exit:
    ptls_buffer_dispose(&labeled_ikm);
    return ret;
}